

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::flipcertify
          (tetgenmesh *this,triface *chkface,badface **pqueue,point plane_pa,point plane_pb,
          point plane_pc)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  point pb;
  badface *pbVar7;
  double dVar8;
  double dVar9;
  int local_e4;
  int local_e0;
  int i;
  int boti;
  int topi;
  double ori4;
  double insph;
  double w [5];
  point p [5];
  face checksh;
  triface neightet;
  badface *nextbf;
  badface *prevbf;
  badface *parybf;
  point plane_pc_local;
  point plane_pb_local;
  point plane_pa_local;
  badface **pqueue_local;
  triface *chkface_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&checksh.shver);
  face::face((face *)(p + 4));
  fsym(this,chkface,(triface *)&checksh.shver);
  pb = org(this,chkface);
  p[0] = dest(this,chkface);
  p[1] = apex(this,chkface);
  p[2] = oppo(this,chkface);
  p[3] = oppo(this,(triface *)&checksh.shver);
  local_e0 = 0;
  i = 0;
  for (local_e4 = 0; local_e4 < 3; local_e4 = local_e4 + 1) {
    bVar1 = pmarktest2ed(this,p[(long)local_e4 + -1]);
    if (bVar1) {
      i = i + 1;
    }
    bVar1 = pmarktest3ed(this,p[(long)local_e4 + -1]);
    if (bVar1) {
      local_e0 = local_e0 + 1;
    }
  }
  if ((i == 0) || (local_e0 == 0)) {
    for (local_e4 = 3; local_e4 < 5; local_e4 = local_e4 + 1) {
      bVar1 = pmarktest2ed(this,p[(long)local_e4 + -1]);
      if (bVar1) {
        i = i + 1;
      }
      bVar1 = pmarktest3ed(this,p[(long)local_e4 + -1]);
      if (bVar1) {
        local_e0 = local_e0 + 1;
      }
    }
    if (((((i == 0) || (local_e0 == 0)) && (p[2] != this->dummypoint)) &&
        ((p[3] != this->dummypoint && (tspivot(this,chkface,(face *)(p + 4)), p[4] == (point)0x0))))
       && (dVar8 = insphere_s(this,p[0],pb,p[1],p[2],p[3]), 0.0 < dVar8)) {
      if (2 < this->b->verbose) {
        uVar2 = pointmark(this,pb);
        uVar3 = pointmark(this,p[0]);
        uVar4 = pointmark(this,p[1]);
        uVar5 = pointmark(this,p[2]);
        uVar6 = pointmark(this,p[3]);
        printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n",(ulong)uVar2,(ulong)uVar3,
               (ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
      }
      pbVar7 = (badface *)memorypool::alloc(this->flippool);
      pbVar7->key = 0.0;
      triface::operator=((triface *)pbVar7,chkface);
      pbVar7->forg = pb;
      pbVar7->fdest = p[0];
      pbVar7->fapex = p[1];
      pbVar7->foppo = p[2];
      pbVar7->noppo = p[3];
      if (*pqueue == (badface *)0x0) {
        *pqueue = pbVar7;
        pbVar7->nextitem = (badface *)0x0;
      }
      else {
        pbVar7->nextitem = *pqueue;
        *pqueue = pbVar7;
      }
    }
  }
  else {
    for (local_e4 = 0; local_e4 < 5; local_e4 = local_e4 + 1) {
      bVar1 = pmarktest2ed(this,p[(long)local_e4 + -1]);
      if (bVar1) {
        dVar8 = orient3dfast(this,plane_pa,plane_pb,plane_pc,p[(long)local_e4 + -1]);
        w[(long)local_e4 + -1] = dVar8;
        if (w[(long)local_e4 + -1] <= 0.0 && w[(long)local_e4 + -1] != 0.0) {
          w[(long)local_e4 + -1] = -w[(long)local_e4 + -1];
        }
      }
      else {
        w[(long)local_e4 + -1] = 0.0;
      }
    }
    dVar8 = insphere(p[0],pb,p[1],p[2],p[3]);
    dVar9 = orient4d(p[0],pb,p[1],p[2],p[3],w[0],insph,w[1],w[2],w[3]);
    if (0.0 < dVar9) {
      if (2 < this->b->verbose) {
        uVar2 = pointmark(this,pb);
        uVar3 = pointmark(this,p[0]);
        uVar4 = pointmark(this,p[1]);
        uVar5 = pointmark(this,p[2]);
        uVar6 = pointmark(this,p[3]);
        printf("      Insert face (%d, %d, %d) - %d, %d\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)uVar5,(ulong)uVar6);
      }
      pbVar7 = (badface *)memorypool::alloc(this->flippool);
      pbVar7->key = -dVar8 / dVar9;
      triface::operator=((triface *)pbVar7,chkface);
      pbVar7->forg = pb;
      pbVar7->fdest = p[0];
      pbVar7->fapex = p[1];
      pbVar7->foppo = p[2];
      pbVar7->noppo = p[3];
      if (*pqueue == (badface *)0x0) {
        *pqueue = pbVar7;
        pbVar7->nextitem = (badface *)0x0;
      }
      else {
        nextbf = (badface *)0x0;
        for (neightet._8_8_ = *pqueue;
            (neightet._8_8_ != 0 && (*(double *)(neightet._8_8_ + 0x20) < pbVar7->key));
            neightet._8_8_ = *(undefined8 *)(neightet._8_8_ + 0x80)) {
          nextbf = (badface *)neightet._8_8_;
        }
        if (nextbf == (badface *)0x0) {
          *pqueue = pbVar7;
        }
        else {
          nextbf->nextitem = pbVar7;
        }
        pbVar7->nextitem = (badface *)neightet._8_8_;
      }
    }
  }
  return;
}

Assistant:

void tetgenmesh::flipcertify(triface *chkface,badface **pqueue,point plane_pa,
                             point plane_pb, point plane_pc)
{
  badface *parybf, *prevbf, *nextbf;
  triface neightet;
  face checksh;
  point p[5];
  REAL w[5];
  REAL insph, ori4;
  int topi, boti;
  int i;

  // Compute the flip time \tau.
  fsym(*chkface, neightet);

  p[0] = org(*chkface);
  p[1] = dest(*chkface);
  p[2] = apex(*chkface);
  p[3] = oppo(*chkface);
  p[4] = oppo(neightet);

  // Check if the face is a crossing face.
  topi = boti = 0;
  for (i = 0; i < 3; i++) {
    if (pmarktest2ed(p[i])) topi++;
    if (pmarktest3ed(p[i])) boti++;
  }
  if ((topi == 0) || (boti == 0)) {
    // It is not a crossing face.
    // return;
    for (i = 3; i < 5; i++) {
      if (pmarktest2ed(p[i])) topi++;
      if (pmarktest3ed(p[i])) boti++;
    }
    if ((topi == 0) || (boti == 0)) {
      // The two tets sharing at this face are on one side of the facet.
      // Check if this face is locally Delaunay (due to rounding error).
      if ((p[3] != dummypoint) && (p[4] != dummypoint)) {
        // Do not check it if it is a subface.
        tspivot(*chkface, checksh);
        if (checksh.sh == NULL) {
          insph = insphere_s(p[1], p[0], p[2], p[3], p[4]);
          if (insph > 0) {
            // Add the face into queue.
            if (b->verbose > 2) {
              printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n", 
                     pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                     pointmark(p[3]), pointmark(p[4]));
            }
            parybf = (badface *) flippool->alloc();
            parybf->key = 0.;  // tau = 0, do immediately.
            parybf->tt = *chkface;
            parybf->forg = p[0];
            parybf->fdest = p[1];
            parybf->fapex = p[2];
            parybf->foppo = p[3];
            parybf->noppo = p[4];
            // Add it at the top of the priority queue.
            if (*pqueue == NULL) {
              *pqueue = parybf;
              parybf->nextitem = NULL;
            } else {
              parybf->nextitem = *pqueue;
              *pqueue = parybf;
            }
          } // if (insph > 0)
        } // if (checksh.sh == NULL)
      }
    }
    return; // Test: omit this face.
  }

  // Decide the "height" for each point.
  for (i = 0; i < 5; i++) {
    if (pmarktest2ed(p[i])) {
      // A top point has a positive weight.
      w[i] = orient3dfast(plane_pa, plane_pb, plane_pc, p[i]);      
      if (w[i] < 0) w[i] = -w[i];
    } else {
      w[i] = 0;
    }
  }

  insph = insphere(p[1], p[0], p[2], p[3], p[4]);
  ori4 = orient4d(p[1], p[0], p[2], p[3], p[4], w[1], w[0], w[2], w[3], w[4]);
  if (ori4 > 0) {
    // Add the face into queue.
    if (b->verbose > 2) {
      printf("      Insert face (%d, %d, %d) - %d, %d\n", pointmark(p[0]),
        pointmark(p[1]), pointmark(p[2]), pointmark(p[3]), pointmark(p[4]));
    }
    
    parybf = (badface *) flippool->alloc();

    parybf->key = -insph / ori4;
    parybf->tt = *chkface;
    parybf->forg = p[0];
    parybf->fdest = p[1];
    parybf->fapex = p[2];
    parybf->foppo = p[3];
    parybf->noppo = p[4];

    // Push the face into priority queue.
    //pq.push(bface);
    if (*pqueue == NULL) {
      *pqueue = parybf;
      parybf->nextitem = NULL;
    } else {
      // Search an item whose key is larger or equal to current key.
      prevbf = NULL;
      nextbf = *pqueue;
      //if (!b->flipinsert_random) { // Default use a priority queue.
        // Insert the item into priority queue.
        while (nextbf != NULL) {
          if (nextbf->key < parybf->key) {
            prevbf = nextbf;
            nextbf = nextbf->nextitem;
          } else {
            break;
          }
        }
      //} // if (!b->flipinsert_random)
      // Insert the new item between prev and next items.
      if (prevbf == NULL) {
        *pqueue = parybf;
      } else {
        prevbf->nextitem = parybf;
      }
      parybf->nextitem = nextbf;
    }
  } else if (ori4 == 0) {
    
  }
}